

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::predictMultiple(IMLE *this,Z *z)

{
  bool bVar1;
  Scalar *pSVar2;
  Index in_RDI;
  int worseSol;
  int newSol2;
  int newSol1;
  Z *in_stack_00000288;
  IMLE *in_stack_00000290;
  int *in_stack_00000350;
  int *in_stack_00000358;
  IMLE *in_stack_00000360;
  IMLE *in_stack_00000368;
  int in_stack_00000544;
  int in_stack_00000548;
  int in_stack_0000054c;
  IMLE *in_stack_00000550;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffe0;
  
  predict(in_stack_00000290,in_stack_00000288);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_ffffffffffffffe0,in_RDI);
  if (((*pSVar2 != 0.0) || (NAN(*pSVar2))) &&
     (bVar1 = validForwardSolutions
                        (in_stack_00000368,&in_stack_00000360->d,in_stack_00000358,in_stack_00000350
                        ), !bVar1)) {
    do {
      *(int *)(in_RDI + 0x284) = *(int *)(in_RDI + 0x284) + 1;
      clusterForwardSolutions
                (in_stack_00000550,in_stack_0000054c,in_stack_00000548,in_stack_00000544);
      bVar1 = validForwardSolutions
                        (in_stack_00000368,&in_stack_00000360->d,in_stack_00000358,in_stack_00000350
                        );
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    getForwardSolutions(in_stack_00000360);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictMultiple(Z const &z)
{
    predict(z);

    if( sum_p_z(0) == 0.0 )
        return;

    int newSol1, newSol2, worseSol;
    if( !validForwardSolutions(newSol1, newSol2, worseSol) )
    {

        do
        {
            nSolFound++;
            clusterForwardSolutions(newSol1, newSol2, worseSol);
        } while ( !validForwardSolutions(newSol1, newSol2, worseSol) );

        getForwardSolutions();
    }

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;
}